

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyFixNodeLinks(Node *node)

{
  Node **ppNVar1;
  Node *pNVar2;
  
  if (node->prev == (Node *)0x0) {
    ppNVar1 = &node->parent->content;
  }
  else {
    ppNVar1 = &node->prev->next;
  }
  *ppNVar1 = node;
  if (node->next == (Node *)0x0) {
    ppNVar1 = &node->parent->last;
  }
  else {
    ppNVar1 = &node->next->prev;
  }
  *ppNVar1 = node;
  for (pNVar2 = node->content; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next) {
    pNVar2->parent = node;
  }
  return;
}

Assistant:

void TY_(FixNodeLinks)(Node *node)
{
    Node *child;

    if (node->prev)
        node->prev->next = node;
    else
        node->parent->content = node;

    if (node->next)
        node->next->prev = node;
    else
        node->parent->last = node;

    for (child = node->content; child; child = child->next)
        child->parent = node;
}